

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionProfile.cpp
# Opt level: O2

region_profile_t * __thiscall
cali::RegionProfile::exclusive_region_times
          (region_profile_t *__return_storage_ptr__,RegionProfile *this,string *region_type)

{
  double dVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  FlatExclusiveRegionProfile rp;
  Channel chn;
  Caliper c;
  FlatExclusiveRegionProfile FStack_288;
  undefined1 local_278 [16];
  SnapshotFlushFn local_268;
  Caliper local_248;
  Log local_228;
  
  Caliper::Caliper(&local_248);
  ChannelController::channel((ChannelController *)local_278);
  FlatExclusiveRegionProfile::FlatExclusiveRegionProfile
            (&FStack_288,&local_248.super_CaliperMetadataAccessInterface,"sum#time.duration.ns",
             (region_type->_M_dataplus)._M_p);
  if (((element_type *)local_278._8_8_ == (element_type *)0x0) ||
     ((int)*(size_type *)(local_278._8_8_ + 8) < 1)) {
    std::ofstream::ofstream(&local_228);
    local_228.m_level = 1;
    poVar2 = Log::stream(&local_228);
    poVar2 = std::operator<<(poVar2,
                             "RegionProfile::exclusive_region_times(): channel is not enabled");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ofstream::~ofstream(&local_228);
  }
  else {
    std::
    function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
    ::function<cali::FlatExclusiveRegionProfile&,void>
              ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                *)(local_278 + 0x10),&FStack_288);
    Caliper::flush(&local_248,(ChannelBody *)local_278._0_8_,(SnapshotView)ZEXT816(0),
                   (SnapshotFlushFn *)(local_278 + 0x10));
    std::_Function_base::~_Function_base((_Function_base *)(local_278 + 0x10));
  }
  FlatExclusiveRegionProfile::result_abi_cxx11_(__return_storage_ptr__,&FStack_288);
  dVar1 = (__return_storage_ptr__->
          super__Tuple_impl<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_double,_double>
          ).super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>._M_head_impl
  ;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_double,_double>
  ).super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
  super__Head_base<2UL,_double,_false>._M_head_impl =
       (__return_storage_ptr__->
       super__Tuple_impl<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_double,_double>
       ).super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
       super__Head_base<2UL,_double,_false>._M_head_impl * 1e-09;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_double,_double>
  ).super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>._M_head_impl =
       dVar1 * 1e-09;
  for (p_Var3 = *(_Base_ptr *)
                 ((long)&(__return_storage_ptr__->
                         super__Tuple_impl<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_double,_double>
                         ).
                         super__Head_base<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_false>
                         ._M_head_impl._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      (_Rb_tree_header *)p_Var3 !=
      &(__return_storage_ptr__->
       super__Tuple_impl<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_double,_double>
       ).
       super__Head_base<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_false>
       ._M_head_impl._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
    *(double *)(p_Var3 + 2) = *(double *)(p_Var3 + 2) * 1e-09;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&FStack_288.mP.
              super___shared_ptr<cali::FlatExclusiveRegionProfile::FlatExclusiveRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Channel::~Channel((Channel *)local_278);
  return __return_storage_ptr__;
}

Assistant:

RegionProfile::region_profile_t RegionProfile::exclusive_region_times(const std::string& region_type)
{
    Caliper                    c;
    Channel                    chn = channel();
    FlatExclusiveRegionProfile rp(c, "sum#time.duration.ns", region_type.c_str());

    if (chn)
        c.flush(chn.body(), SnapshotView(), rp);
    else
        Log(1).stream() << "RegionProfile::exclusive_region_times(): channel is not enabled" << std::endl;

    auto res = rp.result();

    // convert from nanosec to sec
    std::get<1>(res) *= 1e-9;
    std::get<2>(res) *= 1e-9;
    for (auto& p : std::get<0>(res))
        p.second *= 1e-9;

    return res;
}